

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_ini_token>
          (xr_ini_writer *this,undefined8 *container)

{
  xr_token *pxVar1;
  uint32_t dummy;
  xr_token *t;
  write_ini_token local_29;
  
  pxVar1 = (xr_token *)container[1];
  dummy = 0;
  for (t = (xr_token *)*container; t != pxVar1; t = t + 1) {
    write_ini_token::operator()(&local_29,t,this,dummy);
    dummy = dummy + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}